

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall Highs::handleInfCost(Highs *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  ObjSense OVar3;
  iterator __position;
  iterator iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  long lVar9;
  char *format;
  double dVar10;
  double upper;
  double lower;
  double cost;
  uint local_8c;
  double local_88;
  double local_80;
  double local_78;
  vector<double,std::allocator<double>> *local_70;
  vector<double,std::allocator<double>> *local_68;
  vector<int,std::allocator<int>> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if ((this->model_).lp_.has_infinite_cost_ == true) {
    local_48 = (this->options_).super_HighsOptionsStruct.infinite_cost;
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    pvVar1 = &(this->model_).lp_.col_lower_;
    pvVar2 = &(this->model_).lp_.col_upper_;
    local_60 = (vector<int,std::allocator<int>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_index;
    local_68 = (vector<double,std::allocator<double>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_cost;
    local_70 = (vector<double,std::allocator<double>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_lower;
    iVar7 = (this->model_).lp_.num_col_;
    bVar6 = true;
    do {
      bVar5 = bVar6;
      local_8c = 0;
      if (0 < iVar7) {
        do {
          lVar9 = (long)(int)local_8c;
          local_78 = (this->model_).lp_.col_cost_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          if ((local_78 <= local_58) || (local_48 <= local_78)) {
            local_80 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar9];
            local_88 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar9];
            bVar6 = HighsLp::isMip(&(this->model_).lp_);
            if ((bVar6) &&
               ((this->model_).lp_.integrality_.
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_8c] == kInteger)) {
              local_80 = ceil(local_80);
              local_88 = floor(local_88);
            }
            OVar3 = (this->model_).lp_.sense_;
            pvVar8 = pvVar1;
            dVar10 = local_88;
            if (local_78 <= local_58) {
              if (OVar3 == kMinimize) {
                if (local_88 == INFINITY) {
                  format = 
                  "Cannot minimize with a cost on variable %d of %g and upper bound of %g\n";
                  goto LAB_00233f0a;
                }
              }
              else {
                pvVar8 = pvVar2;
                dVar10 = local_80;
                if (local_80 == -INFINITY) {
                  format = 
                  "Cannot maximize with a cost on variable %d of %g and lower bound of %g\n";
                  goto LAB_00233f0a;
                }
              }
            }
            else if (OVar3 == kMinimize) {
              pvVar8 = pvVar2;
              dVar10 = local_80;
              if (local_80 == -INFINITY) {
                format = "Cannot minimize with a cost on variable %d of %g and lower bound of %g\n";
LAB_00233f0a:
                highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format,
                             (ulong)local_8c);
                return kError;
              }
            }
            else if (local_88 == INFINITY) {
              format = "Cannot maximize with a cost on variable %d of %g and upper bound of %g\n";
              goto LAB_00233f0a;
            }
            if (!bVar5) {
              (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[(int)local_8c] = dVar10;
              __position._M_current =
                   *(pointer *)
                    ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
              if (__position._M_current ==
                  *(pointer *)
                   ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_60,__position,(int *)&local_8c);
              }
              else {
                *__position._M_current = local_8c;
                *(int **)((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 8) = __position._M_current + 1;
              }
              iVar4._M_current =
                   *(pointer *)
                    ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + 8);
              if (iVar4._M_current ==
                  *(pointer *)
                   ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 0x10)) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_68,iVar4,&local_78);
              }
              else {
                *iVar4._M_current = local_78;
                *(double **)
                 ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) = iVar4._M_current + 1;
              }
              iVar4._M_current =
                   *(pointer *)
                    ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + 8);
              if (iVar4._M_current ==
                  *(pointer *)
                   ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 0x10)) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_70,iVar4,&local_80);
              }
              else {
                *iVar4._M_current = local_80;
                *(double **)
                 ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) = iVar4._M_current + 1;
              }
              iVar4._M_current =
                   *(pointer *)
                    ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + 8);
              if (iVar4._M_current ==
                  *(pointer *)
                   ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 0x10)) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)
                           &(this->model_).lp_.mods_.save_inf_cost_variable_upper,iVar4,&local_88);
              }
              else {
                *iVar4._M_current = local_88;
                *(double **)
                 ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) = iVar4._M_current + 1;
              }
              (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[(int)local_8c] = 0.0;
            }
            iVar7 = (this->model_).lp_.num_col_;
          }
          local_8c = local_8c + 1;
        } while ((int)local_8c < iVar7);
      }
      bVar6 = false;
    } while (bVar5);
    (this->model_).lp_.has_infinite_cost_ = false;
  }
  return kOk;
}

Assistant:

HighsStatus Highs::handleInfCost() {
  HighsLp& lp = this->model_.lp_;
  if (!lp.has_infinite_cost_) return HighsStatus::kOk;
  HighsLpMods& mods = lp.mods_;
  double inf_cost = this->options_.infinite_cost;
  for (HighsInt k = 0; k < 2; k++) {
    // Pass twice: first checking that infinite costs can be handled,
    // then handling them, so that model is unmodified if infinite
    // costs cannot be handled
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double cost = lp.col_cost_[iCol];
      if (cost > -inf_cost && cost < inf_cost) continue;
      double lower = lp.col_lower_[iCol];
      double upper = lp.col_upper_[iCol];
      if (lp.isMip()) {
        if (lp.integrality_[iCol] == HighsVarType::kInteger) {
          lower = std::ceil(lower);
          upper = std::floor(upper);
        }
      }
      if (cost <= -inf_cost) {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with -inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with -inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        }
      } else {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        }
      }
      if (k) {
        mods.save_inf_cost_variable_index.push_back(iCol);
        mods.save_inf_cost_variable_cost.push_back(cost);
        mods.save_inf_cost_variable_lower.push_back(lower);
        mods.save_inf_cost_variable_upper.push_back(upper);
        lp.col_cost_[iCol] = 0;
      }
    }
  }
  // Infinite costs have been removed, but their presence in the
  // original model is known from mods.save_inf_cost_variable_*, so
  // set lp.has_infinite_cost_ to be false to avoid assert when run()
  // is called using copy of model in MIP solver (See #1446)
  lp.has_infinite_cost_ = false;

  return HighsStatus::kOk;
}